

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

bool __thiscall
cmake::FindPackage(cmake *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *this_00;
  Snapshot snapshot;
  bool bVar3;
  bool bVar4;
  int iVar5;
  cmGlobalGenerator *this_01;
  cmLocalGenerator *this_02;
  char *pcVar6;
  cmTarget *this_03;
  cmGeneratorTarget *target;
  long *plVar7;
  long *plVar8;
  bool in_DL;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 uVar9;
  bool collapse;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  char *__end;
  pointer lib;
  string libs;
  string linkLibs;
  string systemFile;
  string frameworkPath;
  string packageName;
  string mode;
  string linkPath;
  string flags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libList;
  string linkFlags;
  string language;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  Snapshot local_48;
  
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&systemFile,(SystemTools *)0x1,in_DL);
  cmState::SetSourceDirectory(this->State,&systemFile);
  paVar1 = &systemFile.field_2;
  uVar9 = extraout_DL;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)systemFile._M_dataplus._M_p != paVar1) {
    operator_delete(systemFile._M_dataplus._M_p,systemFile.field_2._M_allocated_capacity + 1);
    uVar9 = extraout_DL_00;
  }
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&systemFile,(SystemTools *)0x1,(bool)uVar9);
  cmState::SetBinaryDirectory(this->State,&systemFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)systemFile._M_dataplus._M_p != paVar1) {
    operator_delete(systemFile._M_dataplus._M_p,systemFile.field_2._M_allocated_capacity + 1);
  }
  this_01 = (cmGlobalGenerator *)operator_new(0x5c8);
  cmGlobalGenerator::cmGlobalGenerator(this_01,this);
  SetGlobalGenerator(this,this_01);
  cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0,(PositionType)ZEXT816(0));
  snapshot.Position.Tree = local_48.Position.Tree;
  snapshot.State = local_48.State;
  snapshot.Position.Position._0_1_ = (char)local_48.Position.Position;
  snapshot.Position.Position._1_7_ = (int7)(local_48.Position.Position >> 8);
  this_02 = cmGlobalGenerator::MakeLocalGenerator(this_01,snapshot,(cmLocalGenerator *)0x0);
  this_00 = this_02->Makefile;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&systemFile,(SystemTools *)0x1,collapse)
  ;
  cmMakefile::SetCurrentBinaryDirectory(this_00,&systemFile);
  uVar9 = extraout_DL_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)systemFile._M_dataplus._M_p != paVar1) {
    operator_delete(systemFile._M_dataplus._M_p,systemFile.field_2._M_allocated_capacity + 1);
    uVar9 = extraout_DL_02;
  }
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&systemFile,(SystemTools *)0x1,(bool)uVar9);
  cmMakefile::SetCurrentSourceDirectory(this_00,&systemFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)systemFile._M_dataplus._M_p != paVar1) {
    operator_delete(systemFile._M_dataplus._M_p,systemFile.field_2._M_allocated_capacity + 1);
  }
  cmMakefile::SetArgcArgv(this_00,args);
  cmMakefile::GetModulesFile_abi_cxx11_(&systemFile,this_00,"CMakeFindPackageMode.cmake");
  cmMakefile::ReadListFile(this_00,systemFile._M_dataplus._M_p);
  mode._M_dataplus._M_p = (pointer)&mode.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mode,"LANGUAGE","");
  pcVar6 = cmMakefile::GetSafeDefinition(this_00,&mode);
  std::__cxx11::string::string((string *)&language,pcVar6,(allocator *)&packageName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mode._M_dataplus._M_p != &mode.field_2) {
    operator_delete(mode._M_dataplus._M_p,mode.field_2._M_allocated_capacity + 1);
  }
  packageName._M_dataplus._M_p = (pointer)&packageName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&packageName,"MODE","");
  pcVar6 = cmMakefile::GetSafeDefinition(this_00,&packageName);
  std::__cxx11::string::string((string *)&mode,pcVar6,(allocator *)&libs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)packageName._M_dataplus._M_p != &packageName.field_2) {
    operator_delete(packageName._M_dataplus._M_p,packageName.field_2._M_allocated_capacity + 1);
  }
  libs._M_dataplus._M_p = (pointer)&libs.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&libs,"NAME","");
  pcVar6 = cmMakefile::GetSafeDefinition(this_00,&libs);
  std::__cxx11::string::string((string *)&packageName,pcVar6,(allocator *)&linkLibs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)libs._M_dataplus._M_p != &libs.field_2) {
    operator_delete(libs._M_dataplus._M_p,libs.field_2._M_allocated_capacity + 1);
  }
  libs._M_dataplus._M_p = (pointer)&libs.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&libs,"PACKAGE_FOUND","");
  bVar3 = cmMakefile::IsOn(this_00,&libs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)libs._M_dataplus._M_p != &libs.field_2) {
    operator_delete(libs._M_dataplus._M_p,libs.field_2._M_allocated_capacity + 1);
  }
  libs._M_dataplus._M_p = (pointer)&libs.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&libs,"PACKAGE_QUIET","");
  bVar4 = cmMakefile::IsOn(this_00,&libs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)libs._M_dataplus._M_p != &libs.field_2) {
    operator_delete(libs._M_dataplus._M_p,libs.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    iVar5 = std::__cxx11::string::compare((char *)&mode);
    if (iVar5 != 0) {
      iVar5 = std::__cxx11::string::compare((char *)&mode);
      if (iVar5 == 0) {
        paVar1 = &linkLibs.field_2;
        linkLibs._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&linkLibs,"PACKAGE_INCLUDE_DIRS","");
        pcVar6 = cmMakefile::GetSafeDefinition(this_00,&linkLibs);
        std::__cxx11::string::string((string *)&libs,pcVar6,(allocator *)&frameworkPath);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkLibs._M_dataplus._M_p != paVar1) {
          operator_delete(linkLibs._M_dataplus._M_p,
                          CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                                   linkLibs.field_2._M_local_buf[0]) + 1);
        }
        flags._M_dataplus._M_p = (pointer)0x0;
        flags._M_string_length = 0;
        flags.field_2._M_allocated_capacity = 0;
        cmSystemTools::ExpandListArgument
                  (&libs,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&flags,false);
        paVar2 = &frameworkPath.field_2;
        frameworkPath._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&frameworkPath,"");
        cmLocalGenerator::GetIncludeFlags
                  (&linkLibs,this_02,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&flags,(cmGeneratorTarget *)0x0,&language,false,false,&frameworkPath);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)frameworkPath._M_dataplus._M_p != paVar2) {
          operator_delete(frameworkPath._M_dataplus._M_p,
                          CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                                   frameworkPath.field_2._M_local_buf[0]) + 1);
        }
        linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&linkPath,"PACKAGE_DEFINITIONS","");
        pcVar6 = cmMakefile::GetSafeDefinition(this_00,&linkPath);
        std::__cxx11::string::string((string *)&frameworkPath,pcVar6,(allocator *)&linkFlags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
          operator_delete(linkPath._M_dataplus._M_p,
                          CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                                   linkPath.field_2._M_local_buf[0]) + 1);
        }
        printf("%s %s\n",linkLibs._M_dataplus._M_p,frameworkPath._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)frameworkPath._M_dataplus._M_p != paVar2) {
          operator_delete(frameworkPath._M_dataplus._M_p,
                          CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                                   frameworkPath.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkLibs._M_dataplus._M_p != paVar1) {
          operator_delete(linkLibs._M_dataplus._M_p,
                          CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                                   linkLibs.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&flags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)libs._M_dataplus._M_p != &libs.field_2) {
          operator_delete(libs._M_dataplus._M_p,libs.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&mode);
        if (iVar5 == 0) {
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          this_03 = cmMakefile::AddExecutable(this_00,"dummy",&srcs,true);
          libs._M_dataplus._M_p = (pointer)&libs.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&libs,"LINKER_LANGUAGE","");
          cmTarget::SetProperty(this_03,&libs,language._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)libs._M_dataplus._M_p != &libs.field_2) {
            operator_delete(libs._M_dataplus._M_p,libs.field_2._M_allocated_capacity + 1);
          }
          linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&linkLibs,"PACKAGE_LIBRARIES","");
          pcVar6 = cmMakefile::GetSafeDefinition(this_00,&linkLibs);
          std::__cxx11::string::string((string *)&libs,pcVar6,(allocator *)&frameworkPath);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)linkLibs._M_dataplus._M_p != &linkLibs.field_2) {
            operator_delete(linkLibs._M_dataplus._M_p,
                            CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                                     linkLibs.field_2._M_local_buf[0]) + 1);
          }
          libList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          libList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          libList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmSystemTools::ExpandListArgument(&libs,&libList,false);
          if (libList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              libList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            lib = libList.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
            do {
              linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&linkLibs,"dummy","");
              cmMakefile::AddLinkLibraryForTarget(this_00,&linkLibs,lib,GENERAL);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)linkLibs._M_dataplus._M_p != &linkLibs.field_2) {
                operator_delete(linkLibs._M_dataplus._M_p,
                                CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                                         linkLibs.field_2._M_local_buf[0]) + 1);
              }
              lib = lib + 1;
            } while (lib != libList.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
          }
          linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
          linkLibs._M_string_length = 0;
          linkLibs.field_2._M_local_buf[0] = '\0';
          frameworkPath._M_string_length = 0;
          frameworkPath.field_2._M_local_buf[0] = '\0';
          linkPath._M_string_length = 0;
          linkPath.field_2._M_local_buf[0] = '\0';
          flags._M_string_length = 0;
          flags.field_2._M_allocated_capacity =
               flags.field_2._M_allocated_capacity & 0xffffffffffffff00;
          linkFlags._M_string_length = 0;
          linkFlags.field_2._M_local_buf[0] = '\0';
          frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
          linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
          flags._M_dataplus._M_p = (pointer)&flags.field_2;
          linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
          cmGlobalGenerator::CreateGeneratorTargets(this_01,this_02);
          target = cmGlobalGenerator::GetGeneratorTarget(this_01,this_03);
          cmLocalGenerator::GetTargetFlags
                    (this_02,&linkLibs,&frameworkPath,&linkPath,&flags,&linkFlags,target,false);
          std::operator+(&local_a8,&frameworkPath,&linkPath);
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_a8,(ulong)linkLibs._M_dataplus._M_p);
          plVar8 = plVar7 + 2;
          if ((long *)*plVar7 == plVar8) {
            local_78 = *plVar8;
            lStack_70 = plVar7[3];
            local_88 = &local_78;
          }
          else {
            local_78 = *plVar8;
            local_88 = (long *)*plVar7;
          }
          local_80 = plVar7[1];
          *plVar7 = (long)plVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::operator=((string *)&linkLibs,(string *)&local_88);
          if (local_88 != &local_78) {
            operator_delete(local_88,local_78 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          puts(linkLibs._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
            operator_delete(linkFlags._M_dataplus._M_p,
                            CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                                     linkFlags.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)flags._M_dataplus._M_p != &flags.field_2) {
            operator_delete(flags._M_dataplus._M_p,flags.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
            operator_delete(linkPath._M_dataplus._M_p,
                            CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                                     linkPath.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
            operator_delete(frameworkPath._M_dataplus._M_p,
                            CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                                     frameworkPath.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)linkLibs._M_dataplus._M_p != &linkLibs.field_2) {
            operator_delete(linkLibs._M_dataplus._M_p,
                            CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                                     linkLibs.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&libList);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)libs._M_dataplus._M_p != &libs.field_2) {
            operator_delete(libs._M_dataplus._M_p,libs.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&srcs);
        }
      }
      goto LAB_00380184;
    }
    if (bVar4) goto LAB_00380184;
    pcVar6 = "%s found.\n";
  }
  else {
    if (bVar4) goto LAB_00380184;
    pcVar6 = "%s not found.\n";
  }
  printf(pcVar6,packageName._M_dataplus._M_p);
LAB_00380184:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)packageName._M_dataplus._M_p != &packageName.field_2) {
    operator_delete(packageName._M_dataplus._M_p,packageName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mode._M_dataplus._M_p != &mode.field_2) {
    operator_delete(mode._M_dataplus._M_p,mode.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)language._M_dataplus._M_p != &language.field_2) {
    operator_delete(language._M_dataplus._M_p,language.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)systemFile._M_dataplus._M_p != &systemFile.field_2) {
    operator_delete(systemFile._M_dataplus._M_p,systemFile.field_2._M_allocated_capacity + 1);
  }
  if (this_02 != (cmLocalGenerator *)0x0) {
    (*this_02->_vptr_cmLocalGenerator[1])(this_02);
  }
  return bVar3;
}

Assistant:

bool cmake::FindPackage(const std::vector<std::string>& args)
{
  this->SetHomeDirectory
    (cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory
    (cmSystemTools::GetCurrentWorkingDirectory());

  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator *gg = new cmGlobalGenerator(this);
  this->SetGlobalGenerator(gg);

  // read in the list file to fill the cache
  cmsys::auto_ptr<cmLocalGenerator> lg(gg->MakeLocalGenerator());
  cmMakefile* mf = lg->GetMakefile();
  mf->SetCurrentBinaryDirectory
    (cmSystemTools::GetCurrentWorkingDirectory());
  mf->SetCurrentSourceDirectory
    (cmSystemTools::GetCurrentWorkingDirectory());

  mf->SetArgcArgv(args);

  std::string systemFile = mf->GetModulesFile("CMakeFindPackageMode.cmake");
  mf->ReadListFile(systemFile.c_str());

  std::string language = mf->GetSafeDefinition("LANGUAGE");
  std::string mode = mf->GetSafeDefinition("MODE");
  std::string packageName = mf->GetSafeDefinition("NAME");
  bool packageFound = mf->IsOn("PACKAGE_FOUND");
  bool quiet = mf->IsOn("PACKAGE_QUIET");

  if (!packageFound)
    {
    if (!quiet)
      {
      printf("%s not found.\n", packageName.c_str());
      }
    }
  else if (mode == "EXIST")
    {
    if (!quiet)
      {
      printf("%s found.\n", packageName.c_str());
      }
    }
  else if (mode == "COMPILE")
    {
    std::string includes = mf->GetSafeDefinition("PACKAGE_INCLUDE_DIRS");
    std::vector<std::string> includeDirs;
    cmSystemTools::ExpandListArgument(includes, includeDirs);

    std::string includeFlags = lg->GetIncludeFlags(includeDirs, 0, language);

    std::string definitions = mf->GetSafeDefinition("PACKAGE_DEFINITIONS");
    printf("%s %s\n", includeFlags.c_str(), definitions.c_str());
    }
  else if (mode == "LINK")
    {
    const char* targetName = "dummy";
    std::vector<std::string> srcs;
    cmTarget* tgt = mf->AddExecutable(targetName, srcs, true);
    tgt->SetProperty("LINKER_LANGUAGE", language.c_str());

    std::string libs = mf->GetSafeDefinition("PACKAGE_LIBRARIES");
    std::vector<std::string> libList;
    cmSystemTools::ExpandListArgument(libs, libList);
    for(std::vector<std::string>::const_iterator libIt=libList.begin();
            libIt != libList.end();
            ++libIt)
      {
      mf->AddLinkLibraryForTarget(targetName, *libIt,
                                  cmTarget::GENERAL);
      }


    std::string linkLibs;
    std::string frameworkPath;
    std::string linkPath;
    std::string flags;
    std::string linkFlags;
    gg->CreateGeneratorTargets(lg.get());
    cmGeneratorTarget *gtgt = gg->GetGeneratorTarget(tgt);
    lg->GetTargetFlags(linkLibs, frameworkPath, linkPath, flags, linkFlags,
                       gtgt, false);
    linkLibs = frameworkPath + linkPath + linkLibs;

    printf("%s\n", linkLibs.c_str() );

/*    if ( use_win32 )
      {
      tgt->SetProperty("WIN32_EXECUTABLE", "ON");
      }
    if ( use_macbundle)
      {
      tgt->SetProperty("MACOSX_BUNDLE", "ON");
      }*/
    }

  // free generic one if generated
//  this->SetGlobalGenerator(0); // setting 0-pointer is not possible
//  delete gg; // this crashes inside the cmake instance

  return packageFound;
}